

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long decode_packed_entry_number(codebook *book,oggpack_buffer *b)

{
  ogg_uint32_t oVar1;
  long lVar2;
  ulong uVar3;
  long test;
  long p;
  ogg_uint32_t testword;
  long entry;
  long lok;
  long hi;
  long lo;
  int read;
  oggpack_buffer *b_local;
  codebook *book_local;
  
  lo._4_4_ = book->dec_maxlength;
  lVar2 = oggpack_look(b,book->dec_firsttablen);
  if (lVar2 < 0) {
    hi = 0;
    lok = book->used_entries;
  }
  else {
    uVar3 = (ulong)book->dec_firsttable[lVar2];
    if ((book->dec_firsttable[lVar2] & 0x80000000) == 0) {
      oggpack_adv(b,(int)book->dec_codelengths[uVar3 - 1]);
      return uVar3 - 1;
    }
    hi = (long)uVar3 >> 0xf & 0x7fff;
    lok = book->used_entries - (uVar3 & 0x7fff);
  }
  entry = oggpack_look(b,lo._4_4_);
  while (entry < 0 && 1 < lo._4_4_) {
    lo._4_4_ = lo._4_4_ + -1;
    entry = oggpack_look(b,lo._4_4_);
  }
  if (entry < 0) {
    book_local = (codebook *)0xffffffffffffffff;
  }
  else {
    oVar1 = bitreverse((ogg_uint32_t)entry);
    for (; 1 < lok - hi; lok = lok - (uVar3 & -lVar2)) {
      uVar3 = lok - hi >> 1;
      lVar2 = (long)(int)(uint)(oVar1 < book->codelist[hi + uVar3]);
      hi = (uVar3 & lVar2 - 1U) + hi;
    }
    if (lo._4_4_ < book->dec_codelengths[hi]) {
      oggpack_adv(b,lo._4_4_);
      book_local = (codebook *)0xffffffffffffffff;
    }
    else {
      oggpack_adv(b,(int)book->dec_codelengths[hi]);
      book_local = (codebook *)hi;
    }
  }
  return (long)book_local;
}

Assistant:

STIN long decode_packed_entry_number(codebook *book, oggpack_buffer *b){
  int  read=book->dec_maxlength;
  long lo,hi;
  long lok = oggpack_look(b,book->dec_firsttablen);

  if (lok >= 0) {
    long entry = book->dec_firsttable[lok];
    if(entry&0x80000000UL){
      lo=(entry>>15)&0x7fff;
      hi=book->used_entries-(entry&0x7fff);
    }else{
      oggpack_adv(b, book->dec_codelengths[entry-1]);
      return(entry-1);
    }
  }else{
    lo=0;
    hi=book->used_entries;
  }

  /* Single entry codebooks use a firsttablen of 1 and a
     dec_maxlength of 1.  If a single-entry codebook gets here (due to
     failure to read one bit above), the next look attempt will also
     fail and we'll correctly kick out instead of trying to walk the
     underformed tree */

  lok = oggpack_look(b, read);

  while(lok<0 && read>1)
    lok = oggpack_look(b, --read);
  if(lok<0)return -1;

  /* bisect search for the codeword in the ordered list */
  {
    ogg_uint32_t testword=bitreverse((ogg_uint32_t)lok);

    while(hi-lo>1){
      long p=(hi-lo)>>1;
      long test=book->codelist[lo+p]>testword;
      lo+=p&(test-1);
      hi-=p&(-test);
      }

    if(book->dec_codelengths[lo]<=read){
      oggpack_adv(b, book->dec_codelengths[lo]);
      return(lo);
    }
  }

  oggpack_adv(b, read);

  return(-1);
}